

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::strprintf_numbers::test_method(strprintf_numbers *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  ptrdiff_t spt;
  ptrdiff_t pt;
  ssize_t sst;
  size_t st;
  uint64_t u64t;
  int64_t s64t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff898;
  undefined7 in_stack_fffffffffffff8a0;
  undefined1 in_stack_fffffffffffff8a7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8a8;
  const_string *in_stack_fffffffffffff8c0;
  const_string *msg;
  unsigned_long *in_stack_fffffffffffff8c8;
  long *args_1;
  const_string *in_stack_fffffffffffff8d0;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  const_string local_590 [2];
  lazy_ostream local_570 [2];
  assertion_result local_550;
  long local_538 [2];
  const_string local_528;
  const_string local_518 [2];
  lazy_ostream local_4f8 [2];
  assertion_result local_4d8 [2];
  const_string local_4a0 [2];
  lazy_ostream local_480 [2];
  assertion_result local_460 [2];
  undefined8 local_428;
  undefined8 local_420;
  const_string local_418 [2];
  lazy_ostream local_3f8 [2];
  assertion_result local_3d8 [2];
  const_string local_3a0 [2];
  lazy_ostream local_380 [2];
  assertion_result local_360 [2];
  const_string local_328 [2];
  lazy_ostream local_308 [2];
  assertion_result local_2e8 [2];
  undefined8 local_2b0;
  undefined8 local_2a8;
  const_string local_2a0 [2];
  lazy_ostream local_280 [2];
  assertion_result local_260 [2];
  const_string local_228 [2];
  lazy_ostream local_208 [2];
  assertion_result local_1e8 [2];
  const_string local_1b0 [2];
  lazy_ostream local_190 [2];
  assertion_result local_170 [2];
  undefined8 local_138;
  undefined8 local_130;
  const_string local_128 [18];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_130 = 0x8000000000000001;
  local_138 = 0xffffffffffffffff;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0
              );
    tinyformat::format<char[13],long,char[14]>
              ((char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (char (*) [13])in_stack_fffffffffffff8d0,(long *)in_stack_fffffffffffff8c8,
               (char (*) [14])in_stack_fffffffffffff8c0);
    std::operator==(in_stack_fffffffffffff8a8,
                    (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8a8,(bool)in_stack_fffffffffffff8a7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    in_stack_fffffffffffff898 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_170,local_190,local_1b0,0x1f9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff898);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff898);
    std::__cxx11::string::~string(in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0
              );
    tinyformat::format<char[13],unsigned_long,char[14]>
              ((char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (char (*) [13])in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
               (char (*) [14])in_stack_fffffffffffff8c0);
    std::operator==(in_stack_fffffffffffff8a8,
                    (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8a8,(bool)in_stack_fffffffffffff8a7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    in_stack_fffffffffffff898 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e8,local_208,local_228,0x1fa,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff898);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff898);
    std::__cxx11::string::~string(in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0
              );
    tinyformat::format<char[13],unsigned_long,char[14]>
              ((char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (char (*) [13])in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
               (char (*) [14])in_stack_fffffffffffff8c0);
    std::operator==(in_stack_fffffffffffff8a8,
                    (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8a8,(bool)in_stack_fffffffffffff8a7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    in_stack_fffffffffffff898 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_260,local_280,local_2a0,0x1fb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff898);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff898);
    std::__cxx11::string::~string(in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_2a8 = 0xbc614e;
  local_2b0 = 0xffffffffff439eb2;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0
              );
    tinyformat::format<char[13],long,char[14]>
              ((char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (char (*) [13])in_stack_fffffffffffff8d0,(long *)in_stack_fffffffffffff8c8,
               (char (*) [14])in_stack_fffffffffffff8c0);
    std::operator==(in_stack_fffffffffffff8a8,
                    (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8a8,(bool)in_stack_fffffffffffff8a7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    in_stack_fffffffffffff898 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2e8,local_308,local_328,0x1ff,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff898);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff898);
    std::__cxx11::string::~string(in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0
              );
    tinyformat::format<char[13],unsigned_long,char[14]>
              ((char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (char (*) [13])in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
               (char (*) [14])in_stack_fffffffffffff8c0);
    std::operator==(in_stack_fffffffffffff8a8,
                    (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8a8,(bool)in_stack_fffffffffffff8a7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    in_stack_fffffffffffff898 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_360,local_380,local_3a0,0x200,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff898);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff898);
    std::__cxx11::string::~string(in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0
              );
    tinyformat::format<char[13],unsigned_long,char[14]>
              ((char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (char (*) [13])in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
               (char (*) [14])in_stack_fffffffffffff8c0);
    std::operator==(in_stack_fffffffffffff8a8,
                    (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8a8,(bool)in_stack_fffffffffffff8a7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    in_stack_fffffffffffff898 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3d8,local_3f8,local_418,0x201,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff898);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff898);
    std::__cxx11::string::~string(in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_420 = 0x5397fb1;
  local_428 = 0xfffffffffac6804f;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0
              );
    tinyformat::format<char[13],long,char[14]>
              ((char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (char (*) [13])in_stack_fffffffffffff8d0,(long *)in_stack_fffffffffffff8c8,
               (char (*) [14])in_stack_fffffffffffff8c0);
    std::operator==(in_stack_fffffffffffff8a8,
                    (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8a8,(bool)in_stack_fffffffffffff8a7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    in_stack_fffffffffffff898 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_460,local_480,local_4a0,0x205,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff898);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff898);
    std::__cxx11::string::~string(in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0
              );
    tinyformat::format<char[13],long,char[14]>
              ((char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (char (*) [13])in_stack_fffffffffffff8d0,(long *)in_stack_fffffffffffff8c8,
               (char (*) [14])in_stack_fffffffffffff8c0);
    std::operator==(in_stack_fffffffffffff8a8,
                    (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8a8,(bool)in_stack_fffffffffffff8a7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    in_stack_fffffffffffff898 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4d8,local_4f8,local_518,0x206,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff898);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff898);
    std::__cxx11::string::~string(in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    msg = &local_528;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    args_1 = local_538;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               in_stack_fffffffffffff8d0,(size_t)args_1,msg);
    in_stack_fffffffffffff8d0 = local_128;
    tinyformat::format<char[13],long,char[14]>
              ((char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (char (*) [13])in_stack_fffffffffffff8d0,args_1,(char (*) [14])msg);
    in_stack_fffffffffffff8df =
         std::operator==(in_stack_fffffffffffff8a8,
                         (char *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8a8,(bool)in_stack_fffffffffffff8a7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff898);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a8,
               (pointer)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               (unsigned_long)in_stack_fffffffffffff898);
    in_stack_fffffffffffff898 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_550,local_570,local_590,0x207,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff898);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff898);
    std::__cxx11::string::~string(in_stack_fffffffffffff898);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(strprintf_numbers)
{
    int64_t s64t = -9223372036854775807LL; /* signed 64 bit test value */
    uint64_t u64t = 18446744073709551615ULL; /* unsigned 64 bit test value */
    BOOST_CHECK(strprintf("%s %d %s", B, s64t, E) == B" -9223372036854775807 " E);
    BOOST_CHECK(strprintf("%s %u %s", B, u64t, E) == B" 18446744073709551615 " E);
    BOOST_CHECK(strprintf("%s %x %s", B, u64t, E) == B" ffffffffffffffff " E);

    size_t st = 12345678; /* unsigned size_t test value */
    ssize_t sst = -12345678; /* signed size_t test value */
    BOOST_CHECK(strprintf("%s %d %s", B, sst, E) == B" -12345678 " E);
    BOOST_CHECK(strprintf("%s %u %s", B, st, E) == B" 12345678 " E);
    BOOST_CHECK(strprintf("%s %x %s", B, st, E) == B" bc614e " E);

    ptrdiff_t pt = 87654321; /* positive ptrdiff_t test value */
    ptrdiff_t spt = -87654321; /* negative ptrdiff_t test value */
    BOOST_CHECK(strprintf("%s %d %s", B, spt, E) == B" -87654321 " E);
    BOOST_CHECK(strprintf("%s %u %s", B, pt, E) == B" 87654321 " E);
    BOOST_CHECK(strprintf("%s %x %s", B, pt, E) == B" 5397fb1 " E);
}